

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzhyperplane.cpp
# Opt level: O3

REAL __thiscall
TPZHyperPlaneIntersect::EdgeIntersect
          (TPZHyperPlaneIntersect *this,TPZGeoElSide *gelside,TPZHyperPlane *plane)

{
  double dVar1;
  long lVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  REAL distance;
  REAL detjac;
  TPZManVector<double,_3> X;
  TPZFNMatrix<3,_double> axes;
  TPZFNMatrix<1,_double> jacinv;
  TPZFNMatrix<1,_double> edgejac;
  TPZManVector<double,_3> planejac;
  double local_348;
  TPZVec<double> local_320;
  double dStack_300;
  double local_2f8;
  undefined8 uStack_2f0;
  _func_int **local_2e8;
  _func_int **local_2e0;
  _func_int **local_2d8;
  double *local_2d0;
  _func_int **local_2c8;
  undefined **local_2c0;
  _func_int **local_2b8;
  double *local_2b0;
  double *local_2a8;
  ulong local_2a0;
  REAL local_298;
  TPZManVector<double,_3> local_290;
  TPZFMatrix<double> local_258;
  double local_1c8 [4];
  TPZFMatrix<double> local_1a8;
  double local_118 [2];
  TPZFMatrix<double> local_108;
  double adStack_78 [2];
  TPZManVector<double,_3> local_68;
  
  TPZVec<double>::TPZVec(&local_320,0);
  local_320._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7c18;
  local_320.fStore = &dStack_300;
  local_320.fNElements = 1;
  local_320.fNAlloc = 0;
  dStack_300 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZManVector<double,_3>::TPZManVector(&local_290,3);
  TPZGeoElSide::X(gelside,&local_320,&local_290.super_TPZVec<double>);
  lVar9 = *(long *)(plane + 8);
  lVar2 = *(long *)(plane + 0x40);
  local_2f8 = 0.0;
  lVar10 = 0;
  do {
    dVar1 = *(double *)(lVar2 + lVar10 * 8);
    local_2f8 = local_2f8 +
                (local_290.super_TPZVec<double>.fStore[lVar10] - *(double *)(lVar9 + lVar10 * 8)) *
                dVar1;
    local_68.super_TPZVec<double>.fStore[lVar10] = dVar1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  uStack_2f0 = 0;
  if (1e-06 < ABS(local_2f8)) {
    local_2a8 = adStack_78;
    local_2b0 = local_118;
    local_2d0 = local_1c8;
    local_2b8 = (_func_int **)&PTR__TPZManVector_01815498;
    local_2c0 = &PTR__TPZVec_01813df0;
    local_2d8 = (_func_int **)&PTR__TPZFMatrix_018454a8;
    local_2e0 = (_func_int **)&PTR__TPZFNMatrix_018451b8;
    uVar7 = 0;
    local_2e8 = (_func_int **)&PTR__TPZFMatrix_018ba970;
    local_2c8 = (_func_int **)&PTR__TPZFNMatrix_018ba680;
    do {
      pp_Var3 = local_2e8;
      local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
      local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_108.fElem = local_2a8;
      local_108.fGiven = local_2a8;
      local_108.fSize = 1;
      local_2a0 = uVar7;
      local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_2e8;
      TPZVec<int>::TPZVec(&local_108.fPivot.super_TPZVec<int>,0);
      pp_Var5 = local_2b8;
      pp_Var4 = local_2c8;
      local_108.fPivot.super_TPZVec<int>._vptr_TPZVec = local_2b8;
      local_108.fPivot.super_TPZVec<int>.fStore = local_108.fPivot.fExtAlloc;
      local_108.fPivot.super_TPZVec<int>.fNElements = 0;
      local_108.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_108.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_108.fWork.fStore = (double *)0x0;
      local_108.fWork.fNElements = 0;
      local_108.fWork.fNAlloc = 0;
      local_108.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_2c8;
      local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
      local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_1a8.fElem = local_2b0;
      local_1a8.fGiven = local_2b0;
      local_1a8.fSize = 1;
      local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           pp_Var3;
      TPZVec<int>::TPZVec(&local_1a8.fPivot.super_TPZVec<int>,0);
      local_1a8.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var5;
      local_1a8.fPivot.super_TPZVec<int>.fStore = local_1a8.fPivot.fExtAlloc;
      local_1a8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_1a8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_1a8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_1a8.fWork.fStore = (double *)0x0;
      local_1a8.fWork.fNElements = 0;
      local_1a8.fWork.fNAlloc = 0;
      local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           pp_Var4;
      local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
      local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
      local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_2d8;
      local_258.fElem = local_2d0;
      local_258.fGiven = local_2d0;
      local_258.fSize = 3;
      TPZVec<int>::TPZVec(&local_258.fPivot.super_TPZVec<int>,0);
      local_258.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Var5;
      local_258.fPivot.super_TPZVec<int>.fStore = local_258.fPivot.fExtAlloc;
      local_258.fPivot.super_TPZVec<int>.fNElements = 0;
      local_258.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_258.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_258.fWork.fStore = (double *)0x0;
      local_258.fWork.fNElements = 0;
      local_258.fWork.fNAlloc = 0;
      local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_2e0;
      TPZGeoElSide::Jacobian(gelside,&local_320,&local_108,&local_258,&local_298,&local_1a8);
      uVar6 = local_2a0;
      local_348 = 0.0;
      lVar9 = 0;
      do {
        if ((local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_348 = local_348 +
                    local_258.fElem
                    [local_258.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9] *
                    local_68.super_TPZVec<double>.fStore[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      if ((local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         (local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *local_320.fStore = *local_320.fStore - (local_2f8 * *local_1a8.fElem) / local_348;
      TPZGeoElSide::X(gelside,&local_320,&local_290.super_TPZVec<double>);
      lVar9 = *(long *)(plane + 8);
      lVar2 = *(long *)(plane + 0x40);
      local_2f8 = 0.0;
      lVar10 = 0;
      do {
        dVar1 = *(double *)(lVar2 + lVar10 * 8);
        local_2f8 = local_2f8 +
                    (local_290.super_TPZVec<double>.fStore[lVar10] - *(double *)(lVar9 + lVar10 * 8)
                    ) * dVar1;
        local_68.super_TPZVec<double>.fStore[lVar10] = dVar1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      uVar8 = (uint)uVar6 + 1;
      uStack_2f0 = 0;
      TPZFMatrix<double>::~TPZFMatrix(&local_258,&PTR_PTR_01845470);
      TPZFMatrix<double>::~TPZFMatrix(&local_1a8,&PTR_PTR_018ba938);
      TPZFMatrix<double>::~TPZFMatrix(&local_108,&PTR_PTR_018ba938);
    } while ((1e-06 < ABS(local_2f8)) && (uVar7 = (ulong)uVar8, (uint)uVar6 < 4));
    if (uVar8 == 5) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzhyperplane.cpp"
                 ,0xec);
    }
  }
  dVar1 = *local_320.fStore;
  TPZManVector<double,_3>::~TPZManVector(&local_290);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  if (local_320.fStore != &dStack_300) {
    local_320.fNAlloc = 0;
    local_320._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_320.fStore != (double *)0x0) {
      operator_delete__(local_320.fStore);
    }
  }
  return dVar1;
}

Assistant:

REAL TPZHyperPlaneIntersect::EdgeIntersect(const TPZGeoElSide &gelside, const TPZHyperPlane &plane)
{
    TPZManVector<REAL, 1> edgeparam(1,0.);
    TPZManVector<REAL,3> planejac(3), X(3);
    gelside.X(edgeparam, X);
    REAL distance = plane.Distance(X,planejac);
    int niter = 0;
    while (std::abs(distance) > 1.e-6 && niter < 5) {
        TPZFNMatrix<1,REAL> edgejac(1,1), jacinv(1,1);
        TPZFNMatrix<3,REAL> axes(1,3);
        REAL detjac;
        gelside.Jacobian(edgeparam,edgejac, axes, detjac, jacinv);
        REAL inner = 0;
        for (int i=0; i<3; i++) {
            inner += axes(0,i)*planejac[i];
        }
        edgeparam[0] -= jacinv(0,0)*distance/inner;
        gelside.X(edgeparam, X);
        distance = plane.Distance(X, planejac);
        niter++;
    }
    if (niter == 5) {
        DebugStop();
    }
    return edgeparam[0];
}